

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.hpp
# Opt level: O1

floating_type * __thiscall
toml::basic_value<toml::type_config>::as_floating(basic_value<toml::type_config> *this)

{
  string local_38;
  
  if (this->type_ == floating) {
    return (floating_type *)&this->field_1;
  }
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,"toml::value::as_floating()","");
  throw_bad_cast(this,&local_38,floating);
}

Assistant:

floating_type& as_floating()
    {
        if(this->type_ != value_t::floating)
        {
            this->throw_bad_cast("toml::value::as_floating()", value_t::floating);
        }
        return this->floating_.value;
    }